

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cache.cc
# Opt level: O0

void __thiscall
leveldb::TableCache::TableCache(TableCache *this,string *dbname,Options *options,int entries)

{
  long lVar1;
  Cache *pCVar2;
  undefined4 in_ECX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  size_type *in_RDI;
  long in_FS_OFFSET;
  size_type *capacity;
  undefined4 in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = (in_RDX->field_2)._M_allocated_capacity;
  std::__cxx11::string::string
            (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_ECX,in_stack_ffffffffffffffd8));
  in_RDI[5] = (size_type)in_RDX;
  capacity = in_RDI + 6;
  pCVar2 = NewLRUCache((size_t)capacity);
  *capacity = (size_type)pCVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

TableCache::TableCache(const std::string& dbname, const Options& options,
                       int entries)
    : env_(options.env),
      dbname_(dbname),
      options_(options),
      cache_(NewLRUCache(entries)) {}